

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O2

void __thiscall Poll::loop(Poll *this)

{
  size_type sVar1;
  int iVar2;
  uint64_t uVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  Error *this_00;
  ulong uVar6;
  nfds_t __nfds;
  pointer ppVar7;
  _Self __tmp;
  const_iterator __position;
  value_type fd;
  shared_ptr<Subscriber> listener;
  uint64_t local_48;
  
  local_48 = current_time_millis();
  while ((this->shutdown == false && (sVar1 = (this->subs)._M_h._M_element_count, sVar1 != 0))) {
    ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_start;
    __nfds = (long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppVar7 >> 3;
    if (sVar1 * 3 < __nfds) {
      compact(this);
      ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start;
      __nfds = (long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppVar7 >> 3;
    }
    iVar2 = poll((pollfd *)ppVar7,__nfds,100);
    iVar2 = no_err(iVar2,"error in poll");
    if ((iVar2 == 0) || (uVar3 = current_time_millis(), 100 < uVar3 - local_48)) {
      local_48 = current_time_millis();
      __position._M_node = (this->alarms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (((_Rb_tree_header *)__position._M_node !=
              &(this->alarms)._M_t._M_impl.super__Rb_tree_header &&
             (*(ulong *)(__position._M_node + 1) <= local_48))) {
        Alarm::on_timeout((Alarm *)__position._M_node[1]._M_parent);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Alarm>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<Alarm>>>>
                            *)&this->alarms,__position);
        __position._M_node = p_Var5;
      }
    }
    else {
      for (uVar6 = 0;
          ppVar7 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar6 < (ulong)((long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 3);
          uVar6 = uVar6 + 1) {
        fd = ppVar7[uVar6];
        if ((ulong)fd >> 0x30 != 0) {
          iVar4 = std::
                  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->subs)._M_h,&fd.fd);
          if (iVar4.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>.
              _M_cur == (__node_type *)0x0) {
            this_00 = (Error *)__cxa_allocate_exception(0x3f0);
            Error::Error(this_00,"No handler for fd %d",(ulong)fd & 0xffffffff);
            __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
          }
          std::__shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                            ._M_cur + 0x10));
          if (((ulong)fd & 0x1000000000000) != 0) {
            (*(listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Subscriber[1])
                      (listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       this);
          }
          if ((fd.revents & 4U) != 0) {
            (*(listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Subscriber[2])
                      (listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       this);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&listener.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
  }
  return;
}

Assistant:

void Poll::loop() {
  uint64_t time = current_time_millis();
  while (!this->shutdown && this->subs.size() > 0) {
    if (this->fds.size() > COMPACTION_THRESHOLD * this->subs.size())
      compact();
    int changed_fds = no_err(poll(&fds[0], fds.size(), WAIT_QUANTUM), "error in poll");
    if (changed_fds == 0 || current_time_millis() - time > WAIT_QUANTUM) { //Timeout occured
      time = current_time_millis();
      for (auto it = alarms.cbegin(); it != alarms.cend() && it->first <= time;) {
        it->second->on_timeout();
        alarms.erase(it++);
      }
      continue;
    }
    for (int i = 0; i < fds.size(); ++i) {
      auto fd = fds[i];
      if (fd.revents == 0) continue;
      auto listener_itr = this->subs.find(fd.fd);
      if (listener_itr == this->subs.end()) {
        throw Error("No handler for fd %d", fd.fd);
      }
      std::shared_ptr<Subscriber> listener = listener_itr->second;
      try {
        if (fd.revents & POLLIN) {
          listener->on_input(*this);
        }
        if (fd.revents & POLLOUT) {
          listener->on_output(*this);
        }
        if (fd.revents & !(POLLIN | POLLOUT)) {
          std::cout << "Error event from poll " << fd.revents << std::endl;
          listener->on_error(*this, fd.revents);
        }
      } catch (Error &e) {
        printf("Error in event loop %s listener=%s pollfd{ev=%d, fd=%d, revents=%d}\n",
               e.what(), &listener->get_name()[0], fd.events, fd.fd, fd.revents);
      }
    }
  }
}